

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void __thiscall CGameConsole::OnRender(CGameConsole *this)

{
  char **ppcVar1;
  uint uVar2;
  IGraphics *pIVar3;
  IClient *pIVar4;
  ITextRender *pIVar5;
  IConsole *pIVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  CUIRect *pCVar11;
  char *pcVar12;
  float *pCurrent;
  long lVar13;
  CGameConsole *pCVar14;
  CInstance *pCVar15;
  CGameConsole *this_00;
  char *pcVar16;
  bool bVar17;
  long in_FS_OFFSET;
  float fVar18;
  float fVar19;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar20;
  float fVar21;
  float fVar22;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar23;
  float fVar24;
  float fVar25;
  CCompletionOptionRenderInfo Info;
  char aBuf [128];
  float local_2ec;
  float local_2e8;
  CGameConsole *local_2d0;
  CTextCursor *local_2c8;
  char **local_2c0;
  undefined4 local_2b8;
  int local_2b4;
  undefined4 local_2b0;
  char *local_2a8;
  float local_2a0;
  float local_29c;
  long local_298;
  float local_290;
  float local_28c;
  char local_288 [512];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar14 = (CGameConsole *)&((this->super_CComponent).m_pClient)->m_UI;
  pCVar11 = CUI::Screen((CUI *)pCVar14);
  fVar21 = pCVar11->x;
  fVar22 = pCVar11->y;
  fVar24 = pCVar11->w;
  fVar25 = pCVar11->h;
  fVar18 = TimeNow(pCVar14);
  local_2e8 = (fVar18 - (this->m_StateChangeEnd - this->m_StateChangeDuration)) /
              this->m_StateChangeDuration;
  if (1.0 <= local_2e8) {
    local_2e8 = 1.0;
    if (this->m_ConsoleState == 1) {
      this->m_ConsoleState = 2;
      pCVar15 = &this->m_LocalConsole;
      if (this->m_ConsoleType == 1) {
        pCVar15 = &this->m_RemoteConsole;
      }
      CLineInput::Activate(&pCVar15->m_Input,CONSOLE);
    }
    else if (this->m_ConsoleState == 3) {
      this->m_ConsoleState = 0;
      pCVar15 = &this->m_LocalConsole;
      if (this->m_ConsoleType == 1) {
        pCVar15 = &this->m_RemoteConsole;
      }
      CLineInput::Deactivate(&pCVar15->m_Input);
    }
  }
  iVar8 = this->m_ConsoleState;
  if (iVar8 == 2) {
    if (((this->super_CComponent).m_pClient)->m_pConfig->m_ClEditor != 0) {
      Toggle(this,0);
      iVar8 = this->m_ConsoleState;
      goto LAB_0013ba84;
    }
LAB_0013ba91:
    (*(((this->super_CComponent).m_pClient)->m_pInput->super_IInterface)._vptr_IInterface[10])();
    iVar8 = this->m_ConsoleState;
  }
  else {
LAB_0013ba84:
    if (iVar8 == 0) goto LAB_0013c7ce;
    if (iVar8 == 2) goto LAB_0013ba91;
  }
  if (iVar8 == 3) {
    local_2e8 = local_2e8 + -1.0 + 1.0;
LAB_0013baf4:
    fVar19 = acosf(local_2e8);
    fVar19 = sinf(fVar19);
  }
  else {
    fVar19 = 1.0;
    if (iVar8 == 1) {
      local_2e8 = 1.0 - local_2e8;
      goto LAB_0013baf4;
    }
  }
  fVar19 = ((fVar25 * 3.0) / 5.0) * fVar19;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[5])
            (fVar21,fVar22,fVar24,fVar25);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0x13f000000;
  local_70 = 0;
  uStack_68 = 0x3f00000000000000;
  local_60 = 2;
  local_5c = 0;
  uStack_54 = 0;
  local_4c = 3;
  local_48 = 0;
  uStack_40 = 0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x20])(pIVar3,&local_88,4);
  local_298 = (ulong)(uint)fVar19 << 0x20;
  local_28c = 10.0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar24;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])
            (pIVar3,(ulong)(uint)g_pData->m_aImages[9].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3e4ccccd,0x3e4ccccd,0x3e4ccccd,0x3f666666);
  if (this->m_ConsoleType == 1) {
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3ecccccd,0x3e4ccccd,0x3e4ccccd,0x3f666666);
  }
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1a])
            (0,fVar19 * -0.075,fVar24 * 0.075 * 0.5,0,pIVar3,0xffffffff);
  local_298 = 0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar24;
  local_28c = fVar19;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0x100000000;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 2;
  local_5c = 0;
  uStack_54 = 0x3e80000000000000;
  local_4c = 3;
  local_48 = 0;
  uStack_40 = 0x3e80000000000000;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x20])(pIVar3,&local_88,4);
  local_298 = (ulong)(uint)(fVar19 + -20.0) << 0x20;
  local_28c = 10.0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar24;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])
            (pIVar3,(ulong)(uint)g_pData->m_aImages[10].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3f800000,0x3f800000,0x3f800000,0x3f666666);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1a])
            (0,0x3dcccccd,fVar24 * 0.015,0x3f666666,pIVar3,0xffffffff);
  local_298 = (ulong)(uint)(fVar19 + -10.0) << 0x20;
  local_28c = 10.0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar24;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pCVar14 = (CGameConsole *)&this->m_LocalConsole;
  if (this->m_ConsoleType == 1) {
    pCVar14 = (CGameConsole *)&this->m_RemoteConsole;
  }
  if ((OnRender()::s_InfoCursor == '\0') &&
     (iVar8 = __cxa_guard_acquire(&OnRender()::s_InfoCursor), iVar8 != 0)) {
    CTextCursor::CTextCursor(&OnRender::s_InfoCursor);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_InfoCursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_InfoCursor);
  }
  aVar20.y = fVar19 + -22.0 + -12.5 + -5.0;
  CTextCursor::Reset(&OnRender::s_InfoCursor,-1);
  OnRender::s_InfoCursor.m_CursorPos.field_1.y = aVar20.y + 12.5 + 2.0;
  OnRender::s_InfoCursor.m_CursorPos.field_0.x =
       *(float *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x70) + 3.0;
  OnRender::s_InfoCursor.m_FontSize = 10.0;
  OnRender::s_InfoCursor.m_MaxWidth = -1.0;
  if ((OnRender()::s_PromptCursor == '\0') &&
     (iVar8 = __cxa_guard_acquire(&OnRender()::s_PromptCursor), iVar8 != 0)) {
    CTextCursor::CTextCursor(&OnRender::s_PromptCursor,10.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_PromptCursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_PromptCursor);
  }
  OnRender::s_PromptCursor.m_CursorPos.field_0.x = 3.0;
  OnRender::s_PromptCursor.m_CursorPos.field_1.y = aVar20.y;
  if (this->m_ConsoleType == 1) {
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pClient;
    if ((pIVar4->m_State & 0xfffffffeU) == 2) {
      iVar8 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x1a])();
      pcVar16 = "ENTER PASSWORD> ";
      if ((char)iVar8 != '\0') {
        pcVar16 = "rcon> ";
      }
    }
    else {
      pcVar16 = "NOT CONNECTED> ";
    }
  }
  else {
    pcVar16 = "> ";
  }
  CTextCursor::Reset(&OnRender::s_PromptCursor,(int64)pcVar16);
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
            (pIVar5,&OnRender::s_PromptCursor,pcVar16,0xffffffff);
  aVar23.x = OnRender::s_PromptCursor.m_CursorPos.field_0.x +
             OnRender::s_PromptCursor.m_Advance.field_0.x;
  this_00 = (CGameConsole *)((pCVar14->m_LocalConsole).m_aInputBuf + 0xe8);
  if ((this->m_ConsoleType == 1) &&
     (pIVar4 = ((this->super_CComponent).m_pClient)->m_pClient, (pIVar4->m_State & 0xfffffffeU) == 2
     )) {
    iVar8 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x1a])();
    bVar7 = (byte)iVar8 ^ 1;
  }
  else {
    bVar7 = 0;
  }
  *(byte *)&(pCVar14->m_LocalConsole).m_Input.m_CursorPos = bVar7;
  (pCVar14->m_LocalConsole).m_Input.m_TextCursor.m_Glyphs.num_elements = 8;
  (pCVar14->m_LocalConsole).m_Input.m_TextCursor.m_Glyphs.list = (CScaledGlyph *)0xffffffff41200000;
  fVar21 = fVar24 + -10.0;
  (pCVar14->m_LocalConsole).m_Input.m_TextCursor.m_Glyphs.list_size = (int)(fVar21 - aVar23.x);
  (pCVar14->m_LocalConsole).m_Input.m_TextCursor.m_Width = (float)aVar23;
  (pCVar14->m_LocalConsole).m_Input.m_TextCursor.m_Height = aVar20.y + 13.5;
  CLineInput::Activate((CLineInput *)this_00,CONSOLE);
  CLineInput::Render((CLineInput *)this_00);
  iVar8 = *(int *)((pCVar14->m_LocalConsole).m_aInputBuf + 0xf8);
  if (OnRender()::s_LastRender == '\0') {
    OnRender(this_00);
  }
  if (((this->m_ConsoleType == 0) ||
      (iVar9 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                 _vptr_IInterface[0x1a])(), (char)iVar9 != '\0')) &&
     (**(char **)&(pCVar14->m_LocalConsole).m_Input.m_TextCursor.m_MaxWidth != '\0')) {
    local_2b8 = *(undefined4 *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x68);
    uVar10 = 0;
    local_2b4 = 0;
    local_2b0 = *(undefined4 *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x70);
    pcVar16 = (pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x74;
    local_29c = 0.0;
    ppcVar1 = (char **)((pCVar14->m_LocalConsole).m_aCompletionMapBuffer + 0x6c);
    local_2c8 = &OnRender::s_InfoCursor;
    pIVar6 = this->m_pConsole;
    uVar2 = *(uint *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x6c);
    local_2d0 = this;
    local_2c0 = ppcVar1;
    local_2a8 = pcVar16;
    local_2a0 = fVar24;
    if (this->m_ConsoleType != 0) {
      iVar9 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface)._vptr_IInterface
                [0x1a])();
      if ((char)iVar9 == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                   _vptr_IInterface[0x1b])();
      }
    }
    (*(pIVar6->super_IInterface)._vptr_IInterface[5])
              (pIVar6,ppcVar1,(ulong)uVar2,(ulong)(uVar10 & 0xff),PossibleCommandsRenderCallback,
               &local_2d0);
    ppcVar1 = local_2c0;
    if ((local_2b4 < 1) && ((pCVar14->m_LocalConsole).m_aCompletionBuffer[0x78] == '\x01')) {
      bVar17 = false;
      lVar13 = 0;
      do {
        pcVar12 = str_startswith_nocase((char *)ppcVar1,s_apMapCommands[lVar13]);
        if (bVar17) break;
        lVar13 = 1;
        bVar17 = true;
      } while (pcVar12 == (char *)0x0);
      if (pcVar12 != (char *)0x0) {
        local_2b8 = *(undefined4 *)((pCVar14->m_LocalConsole).m_aCompletionMapBuffer + 0x68);
        local_2b4 = 0;
        local_29c = 0.0;
        local_2c0 = &(pCVar14->m_LocalConsole).m_pName;
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[6])
                  (this->m_pConsole,local_2c0,PossibleCommandsRenderCallback);
      }
      if ((local_2b4 < 1) && ((pCVar14->m_LocalConsole).m_aCompletionBuffer[0x78] == '\x01')) {
        str_format(local_288,0x200,"Help: %s ",(pCVar14->m_LocalConsole).m_aCommandName + 0x18);
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar5->super_IInterface)._vptr_IInterface[7])(pIVar5,local_2c8,local_288,0xffffffff);
        (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
          [4])(0x3f400000,0x3f400000,0x3f400000,0x3f800000);
        str_format(local_288,0x200,"Syntax: %s %s",
                   (pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x79,
                   (pCVar14->m_LocalConsole).m_aCommandHelp + 0x68);
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar5->super_IInterface)._vptr_IInterface[7])(pIVar5,local_2c8,local_288,0xffffffff);
      }
    }
    fVar22 = *(float *)pcVar16;
    fVar24 = -fVar22;
    if (-fVar22 <= fVar22) {
      fVar24 = fVar22;
    }
    if (fVar24 <= local_2a0) {
      if ((fVar22 != 0.0) || (NAN(fVar22))) {
        fVar25 = (fVar18 - OnRender::s_LastRender) * 10.0;
        fVar24 = 1.0;
        if (fVar25 <= 1.0) {
          fVar24 = fVar25;
        }
        fVar25 = (float)(~-(uint)(fVar25 < 0.0) & (uint)fVar24) * fVar22;
        fVar24 = fVar25 + *(float *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x70);
        *(float *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x70) = fVar24;
        *(float *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x74) = fVar22 - fVar25;
      }
      else {
        fVar24 = *(float *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x70);
      }
    }
    else {
      fVar24 = fVar22 + *(float *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x70);
      *(float *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x70) = fVar24;
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x74] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x75] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x76] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x77] = '\0';
    }
    if (0.0 < fVar24) {
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x70] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x71] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x72] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x73] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x74] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x75] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x76] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x77] = '\0';
      fVar24 = 0.0;
    }
    if ((local_2a0 < local_29c) && (fVar24 < local_2a0 - local_29c)) {
      *(float *)((pCVar14->m_LocalConsole).m_aCompletionBuffer + 0x70) = local_2a0 - local_29c;
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x74] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x75] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x76] = '\0';
      (pCVar14->m_LocalConsole).m_aCompletionBuffer[0x77] = '\0';
    }
  }
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  OnRender::s_LastRender = fVar18;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar5,&OnRender::s_InfoCursor,0,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  if ((OnRender()::s_Cursor == '\0') &&
     (iVar9 = __cxa_guard_acquire(&OnRender()::s_Cursor), iVar9 != 0)) {
    CTextCursor::CTextCursor(&OnRender::s_Cursor);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_Cursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_Cursor);
  }
  aVar20.y = aVar20.y + (float)(iVar8 + -1) * -10.0;
  CTextCursor::Reset(&OnRender::s_Cursor,-1);
  OnRender::s_Cursor.m_CursorPos.field_1.y = aVar20.y;
  OnRender::s_Cursor.m_CursorPos.field_0.x = aVar23.x;
  OnRender::s_Cursor.m_FontSize = 10.0;
  OnRender::s_Cursor.m_MaxLines = -1;
  OnRender::s_Cursor.m_MaxWidth = fVar21;
  pCurrent = (float *)CRingBufferBase::Last((CRingBufferBase *)pCVar14);
  if (OnRender()::s_LastActivePage == '\0') {
    OnRender(pCVar14);
  }
  if (OnRender::s_LastActivePage < 0) {
    iVar8 = 1;
  }
  else {
    iVar8 = 1;
    iVar9 = 0;
    while (pCurrent != (float *)0x0) {
      local_2ec = 0.0;
      while( true ) {
        CTextCursor::Reset(&OnRender::s_Cursor,-1);
        if (*(char *)(pCurrent + 1) == '\x01') {
          (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
            [4])(0x3f800000,0x3f400000,0x3f400000,0x3f800000);
        }
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                  (pIVar5,&OnRender::s_Cursor,(long)pCurrent + 5,0xffffffff);
        (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
          [4])(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
        fVar22 = *pCurrent;
        if (fVar22 < 0.0) {
          fVar22 = OnRender::s_Cursor.m_NextLineAdvanceY + 1.0;
          *pCurrent = fVar22;
        }
        local_2ec = local_2ec + fVar22;
        fVar22 = aVar20.y - local_2ec;
        if (fVar22 <= 12.5) break;
        if (iVar9 == OnRender::s_LastActivePage) {
          OnRender::s_Cursor.m_CursorPos = (vec2)((ulong)(uint)fVar22 << 0x20);
          pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
                    (0x3f800000,pIVar5,&OnRender::s_Cursor,0,0xffffffff);
        }
        pCurrent = (float *)CRingBufferBase::Prev((CRingBufferBase *)pCVar14,pCurrent);
        if (pCurrent == (float *)0x0) goto LAB_0013c6be;
      }
      iVar8 = iVar8 + 1;
      bVar17 = OnRender::s_LastActivePage <= iVar9;
      iVar9 = iVar9 + 1;
      if (bVar17) break;
    }
  }
LAB_0013c6be:
  aVar20 = (pCVar14->m_LocalConsole).m_Input.m_CaretPosition.field_1;
  OnRender::s_LastActivePage = iVar8 + -1;
  if ((int)aVar20 < iVar8 + -1) {
    OnRender::s_LastActivePage = (int)aVar20;
  }
  if ((int)aVar20 < 0) {
    OnRender::s_LastActivePage = 0;
  }
  (pCVar14->m_LocalConsole).m_Input.m_CaretPosition.field_1 =
       (anon_union_4_2_947302a4_for_vector2_base<float>_3)OnRender::s_LastActivePage;
  CTextCursor::Reset(&OnRender::s_Cursor,-1);
  OnRender::s_Cursor.m_MaxWidth = -1.0;
  pcVar16 = Localize("-Page %d-","");
  str_format(local_288,0x80,pcVar16,
             (ulong)((int)(pCVar14->m_LocalConsole).m_Input.m_CaretPosition.field_1 + 1));
  OnRender::s_Cursor.m_CursorPos.field_0 =
       (anon_union_4_2_94730284_for_vector2_base<float>_1)0x41200000;
  OnRender::s_Cursor.m_CursorPos.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
            (pIVar5,&OnRender::s_Cursor,local_288,0xffffffff);
  str_format(local_288,0x80,"v%s","0.7.5");
  CTextCursor::Reset(&OnRender::s_Cursor,-1);
  OnRender::s_Cursor.m_CursorPos.field_1.y = 0.0;
  OnRender::s_Cursor.m_CursorPos.field_0.x = fVar21;
  OnRender::s_Cursor.m_Align = 2;
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
            (pIVar5,&OnRender::s_Cursor,local_288,0xffffffff);
  OnRender::s_Cursor.m_Align = 0;
LAB_0013c7ce:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameConsole::OnRender()
{
	CUIRect Screen = *UI()->Screen();
	float ConsoleMaxHeight = Screen.h*3/5.0f;
	float ConsoleHeight;

	const float Now = TimeNow();
	float Progress = (Now - (m_StateChangeEnd - m_StateChangeDuration)) / float(m_StateChangeDuration);

	if(Progress >= 1.0f)
	{
		if(m_ConsoleState == CONSOLE_CLOSING)
		{
			m_ConsoleState = CONSOLE_CLOSED;
			CurrentConsole()->m_Input.Deactivate();
		}
		else if(m_ConsoleState == CONSOLE_OPENING)
		{
			m_ConsoleState = CONSOLE_OPEN;
			CurrentConsole()->m_Input.Activate(CONSOLE);
		}

		Progress = 1.0f;
	}

	if(m_ConsoleState == CONSOLE_OPEN && Config()->m_ClEditor)
		Toggle(CONSOLETYPE_LOCAL);

	if(m_ConsoleState == CONSOLE_CLOSED)
		return;

	if(m_ConsoleState == CONSOLE_OPEN)
		Input()->MouseModeAbsolute();

	float ConsoleHeightScale;

	if(m_ConsoleState == CONSOLE_OPENING)
		ConsoleHeightScale = ConsoleScaleFunc(Progress);
	else if(m_ConsoleState == CONSOLE_CLOSING)
		ConsoleHeightScale = ConsoleScaleFunc(1.0f-Progress);
	else //if(console_state == CONSOLE_OPEN)
		ConsoleHeightScale = ConsoleScaleFunc(1.0f);

	ConsoleHeight = ConsoleHeightScale*ConsoleMaxHeight;

	Graphics()->MapScreen(Screen.x, Screen.y, Screen.w, Screen.h);

	// do console shadow
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	IGraphics::CColorVertex Array[4] = {
		IGraphics::CColorVertex(0, 0,0,0, 0.5f),
		IGraphics::CColorVertex(1, 0,0,0, 0.5f),
		IGraphics::CColorVertex(2, 0,0,0, 0.0f),
		IGraphics::CColorVertex(3, 0,0,0, 0.0f)};
	Graphics()->SetColorVertex(Array, 4);
	IGraphics::CQuadItem QuadItem(0, ConsoleHeight, Screen.w, 10.0f);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do background
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_CONSOLE_BG].m_Id);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(0.2f, 0.2f, 0.2f,0.9f);
	if(m_ConsoleType == CONSOLETYPE_REMOTE)
		Graphics()->SetColor(0.4f, 0.2f, 0.2f,0.9f);
	Graphics()->QuadsSetSubset(0,-ConsoleHeight*0.075f,Screen.w*0.075f*0.5f,0);
	QuadItem = IGraphics::CQuadItem(0, 0, Screen.w, ConsoleHeight);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do small bar shadow
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	Array[0] = IGraphics::CColorVertex(0, 0,0,0, 0.0f);
	Array[1] = IGraphics::CColorVertex(1, 0,0,0, 0.0f);
	Array[2] = IGraphics::CColorVertex(2, 0,0,0, 0.25f);
	Array[3] = IGraphics::CColorVertex(3, 0,0,0, 0.25f);
	Graphics()->SetColorVertex(Array, 4);
	QuadItem = IGraphics::CQuadItem(0, ConsoleHeight-20, Screen.w, 10);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do the lower bar
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_CONSOLE_BAR].m_Id);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 0.9f);
	Graphics()->QuadsSetSubset(0,0.1f,Screen.w*0.015f,1-0.1f);
	QuadItem = IGraphics::CQuadItem(0,ConsoleHeight-10.0f,Screen.w,10.0f);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	ConsoleHeight -= 22.0f;

	CInstance *pConsole = CurrentConsole();

	{
		float FontSize = 10.0f;
		float RowHeight = FontSize*1.25f;
		float x = 3;
		float y = ConsoleHeight - RowHeight - 5.0f;

		static CTextCursor s_InfoCursor;
		s_InfoCursor.Reset();
		s_InfoCursor.MoveTo(x+pConsole->m_CompletionRenderOffset, y+RowHeight+2.0f);
		s_InfoCursor.m_FontSize = FontSize;
		s_InfoCursor.m_MaxWidth = -1.0f;

		// render prompt
		static CTextCursor s_PromptCursor(FontSize);
		s_PromptCursor.MoveTo(x, y);
		const char *pPrompt = "> ";
		if(m_ConsoleType == CONSOLETYPE_REMOTE)
		{
			if(Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_LOADING)
			{
				if(Client()->RconAuthed())
					pPrompt = "rcon> ";
				else
					pPrompt = "ENTER PASSWORD> ";
			}
			else
				pPrompt = "NOT CONNECTED> ";
		}
		s_PromptCursor.Reset((int64)pPrompt);
		TextRender()->TextOutlined(&s_PromptCursor, pPrompt, -1);

		x = s_PromptCursor.AdvancePosition().x;

		// render console input (wrap line)
		pConsole->m_Input.SetHidden(m_ConsoleType == CONSOLETYPE_REMOTE && (Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_LOADING) && !Client()->RconAuthed());
		CTextCursor *pInputCursor = pConsole->m_Input.GetCursor();
		pInputCursor->m_Align = TEXTALIGN_BL;
		pInputCursor->m_MaxLines = -1;
		pInputCursor->m_FontSize = FontSize;
		pInputCursor->m_MaxWidth = Screen.w - 10.0f - x;
		pInputCursor->MoveTo(x, y + FontSize * 1.35f);

		pConsole->m_Input.Activate(CONSOLE); // ensure the input is active
		pConsole->m_Input.Render();

		y -= (pInputCursor->LineCount() - 1) * FontSize;

		// render possible commands
		static float s_LastRender = Now;
		if((m_ConsoleType == CONSOLETYPE_LOCAL || Client()->RconAuthed()) && pConsole->m_Input.GetString()[0])
		{
			CCompletionOptionRenderInfo Info;
			Info.m_pSelf = this;
			Info.m_WantedCompletion = pConsole->m_CompletionChosen;
			Info.m_EnumCount = 0;
			Info.m_Offset = pConsole->m_CompletionRenderOffset;
			Info.m_pOffsetChange = &pConsole->m_CompletionRenderOffsetChange;
			Info.m_Width = Screen.w;
			Info.m_TotalWidth = 0.0f;
			Info.m_pCurrentCmd = pConsole->m_aCompletionBuffer;
			Info.m_pCursor = &s_InfoCursor;
			m_pConsole->PossibleCommands(Info.m_pCurrentCmd, pConsole->m_CompletionFlagmask, m_ConsoleType != CGameConsole::CONSOLETYPE_LOCAL &&
				Client()->RconAuthed() && Client()->UseTempRconCommands(), PossibleCommandsRenderCallback, &Info);

			if(Info.m_EnumCount <= 0 && pConsole->m_IsCommand)
			{
				if(IsMapCommandPrefix(Info.m_pCurrentCmd))
				{
					Info.m_WantedCompletion = pConsole->m_CompletionMapChosen;
					Info.m_EnumCount = 0;
					Info.m_TotalWidth = 0.0f;
					Info.m_pCurrentCmd = pConsole->m_aCompletionMapBuffer;
					m_pConsole->PossibleMaps(Info.m_pCurrentCmd, PossibleCommandsRenderCallback, &Info);
				}

				if(Info.m_EnumCount <= 0 && pConsole->m_IsCommand)
				{
					char aBuf[512];
					str_format(aBuf, sizeof(aBuf), "Help: %s ", pConsole->m_aCommandHelp);
					TextRender()->TextDeferred(Info.m_pCursor, aBuf, -1);
					TextRender()->TextColor(0.75f, 0.75f, 0.75f, 1);
					str_format(aBuf, sizeof(aBuf), "Syntax: %s %s", pConsole->m_aCommandName, pConsole->m_aCommandParams);
					TextRender()->TextDeferred(Info.m_pCursor, aBuf, -1);
				}
			}

			// instant scrolling if distance too long
			if(absolute(pConsole->m_CompletionRenderOffsetChange) > Info.m_Width)
			{
				pConsole->m_CompletionRenderOffset += pConsole->m_CompletionRenderOffsetChange;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
			// smooth scrolling
			if(pConsole->m_CompletionRenderOffsetChange)
			{
				const float Delta = pConsole->m_CompletionRenderOffsetChange * clamp((Now - s_LastRender) * 10.0f, 0.0f, 1.0f);
				pConsole->m_CompletionRenderOffset += Delta;
				pConsole->m_CompletionRenderOffsetChange -= Delta;
			}
			// clamp to first item
			if(pConsole->m_CompletionRenderOffset > 0.0f)
			{
				pConsole->m_CompletionRenderOffset = 0.0f;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
			// clamp to last item
			if(Info.m_TotalWidth > Info.m_Width && pConsole->m_CompletionRenderOffset < Info.m_Width - Info.m_TotalWidth)
			{
				pConsole->m_CompletionRenderOffset = Info.m_Width - Info.m_TotalWidth;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
		}
		s_LastRender = Now;

		TextRender()->DrawTextOutlined(&s_InfoCursor);

		TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

		// render log (actual page, wrap lines)
		static CTextCursor s_Cursor;
		s_Cursor.Reset();
		s_Cursor.MoveTo(x, y);
		s_Cursor.m_FontSize = FontSize;
		s_Cursor.m_MaxLines = -1;
		s_Cursor.m_MaxWidth = Screen.w - 10.0f;

		CInstance::CBacklogEntry *pEntry = pConsole->m_Backlog.Last();
		float OffsetY = 0.0f;
		const float LineOffset = 1.0f;
		static int s_LastActivePage = pConsole->m_BacklogActPage;
		int TotalPages = 1;
		for(int Page = 0; Page <= s_LastActivePage; ++Page, OffsetY = 0.0f)
		{
			while(pEntry)
			{
				s_Cursor.Reset();
				if(pEntry->m_Highlighted)
					TextRender()->TextColor(1.0f, 0.75f, 0.75f, 1.0f);
				TextRender()->TextDeferred(&s_Cursor, pEntry->m_aText, -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

				// get y offset (calculate it if we haven't yet)
				if(pEntry->m_YOffset < 0.0f)
					pEntry->m_YOffset = s_Cursor.BaseLineY() + LineOffset;
				OffsetY += pEntry->m_YOffset;

				// next page when lines reach the top
				if(y - OffsetY <= RowHeight)
					break;

				// just render output from actual backlog page (render bottom up)
				if(Page == s_LastActivePage)
				{
					s_Cursor.MoveTo(0.0f, y - OffsetY);
					TextRender()->DrawTextOutlined(&s_Cursor);
				}

				pEntry = pConsole->m_Backlog.Prev(pEntry);
			}
			if(!pEntry)
				break;
			TotalPages++;
		}
		pConsole->m_BacklogActPage = clamp(pConsole->m_BacklogActPage, 0, TotalPages - 1);
		s_LastActivePage = pConsole->m_BacklogActPage;

		s_Cursor.Reset();
		s_Cursor.m_MaxWidth = -1;
		// render page
		char aBuf[128];
		str_format(aBuf, sizeof(aBuf), Localize("-Page %d-"), pConsole->m_BacklogActPage+1);
		s_Cursor.MoveTo(10.0f, 0.0f);
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1.0f);

		// render version
		str_format(aBuf, sizeof(aBuf), "v%s", GAME_RELEASE_VERSION);
		s_Cursor.Reset();
		s_Cursor.MoveTo(Screen.w-10.0f, 0.0f);
		s_Cursor.m_Align = TEXTALIGN_RIGHT;
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1.0f);
		s_Cursor.m_Align = TEXTALIGN_LEFT;
	}
}